

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O3

String * __thiscall StringList::join(String *__return_storage_ptr__,StringList *this,String *delim)

{
  _Elt_pointer pSVar1;
  pointer pcVar2;
  _Map_pointer ppSVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  (__return_storage_ptr__->_string)._M_string_length = 0;
  (__return_storage_ptr__->_string).field_2._M_local_buf[0] = '\0';
  pSVar4 = (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pSVar1 = (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 != pSVar1) {
    pSVar5 = (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppSVar3 = (this->super_List<String>)._deque.super__Deque_base<String,_std::allocator<String>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (*(__return_storage_ptr__->_string)._M_dataplus._M_p != '\0') {
        local_50[0] = local_40;
        pcVar2 = (delim->_string)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar2,pcVar2 + (delim->_string)._M_string_length);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      local_70[0] = local_60;
      pcVar2 = (pSVar4->_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + (pSVar4->_string)._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      pSVar4 = pSVar4 + 1;
      if (pSVar4 == pSVar5) {
        pSVar4 = ppSVar3[1];
        ppSVar3 = ppSVar3 + 1;
        pSVar5 = pSVar4 + 0x10;
      }
    } while (pSVar4 != pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringList::join (const String& delim)
{
	String result;

	for (const String& it : deque())
	{
		if (result.isEmpty() == false)
			result += delim;

		result += it;
	}

	return result;
}